

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

int UTF16LEToUTF8(uchar *out,int *outlen,uchar *inb,int *inlenb)

{
  int iVar1;
  ushort *puVar2;
  uint uVar3;
  int iVar4;
  ushort *puVar5;
  uchar *processed;
  byte bVar6;
  int iVar7;
  byte *pbVar8;
  uint uVar9;
  
  iVar1 = *outlen;
  if ((long)iVar1 == 0) {
    *inlenb = 0;
    return 0;
  }
  uVar3 = *inlenb;
  if ((uVar3 & 0x80000001) == 1) {
    uVar3 = uVar3 - 1;
    *inlenb = uVar3;
  }
  puVar5 = (ushort *)inb;
  pbVar8 = out;
  do {
    iVar7 = (int)((long)pbVar8 - (long)out);
    iVar4 = (int)puVar5;
    if ((inb + (ulong)(uint)((int)uVar3 / 2) * 2 <= puVar5) ||
       ((long)*outlen <= ((long)pbVar8 - (long)out) + 5)) goto LAB_001432e2;
    puVar2 = puVar5 + 1;
    uVar9 = (uint)*puVar5;
    if ((uVar9 & 0xfc00) == 0xd800) {
      if (inb + (ulong)(uint)((int)uVar3 / 2) * 2 <= puVar2) {
LAB_001432e2:
        *outlen = iVar7;
        *inlenb = iVar4 - (int)inb;
        return *outlen;
      }
      if ((*puVar2 & 0xfc00) != 0xdc00) {
        *outlen = iVar7;
        *inlenb = iVar4 - (int)inb;
        return -2;
      }
      uVar9 = (*puVar5 & 0x3ff) * 0x400 + (*puVar2 & 0x3ff) + 0x10000;
      puVar2 = puVar5 + 2;
    }
    puVar5 = puVar2;
    if (out + iVar1 <= pbVar8) goto LAB_001432e2;
    if (uVar9 < 0x80) {
      bVar6 = (byte)uVar9;
      iVar4 = -6;
    }
    else if (uVar9 < 0x800) {
      bVar6 = (byte)(uVar9 >> 6) | 0xc0;
      iVar4 = 0;
    }
    else if (uVar9 < 0x10000) {
      bVar6 = (byte)(uVar9 >> 0xc) | 0xe0;
      iVar4 = 6;
    }
    else {
      bVar6 = (byte)(uVar9 >> 0x12) | 0xf0;
      iVar4 = 0xc;
    }
    *pbVar8 = bVar6;
    while ((pbVar8 = pbVar8 + 1, -1 < iVar4 && (pbVar8 < out + iVar1))) {
      *pbVar8 = (byte)(uVar9 >> ((byte)iVar4 & 0x1f)) & 0x3f | 0x80;
      iVar4 = iVar4 + -6;
    }
  } while( true );
}

Assistant:

static int
UTF16LEToUTF8(unsigned char* out, int *outlen,
            const unsigned char* inb, int *inlenb)
{
    unsigned char* outstart = out;
    const unsigned char* processed = inb;
    unsigned char* outend;
    unsigned short* in = (unsigned short*) inb;
    unsigned short* inend;
    unsigned int c, d, inlen;
    unsigned char *tmp;
    int bits;

    if (*outlen == 0) {
        *inlenb = 0;
        return(0);
    }
    outend = out + *outlen;
    if ((*inlenb % 2) == 1)
        (*inlenb)--;
    inlen = *inlenb / 2;
    inend = in + inlen;
    while ((in < inend) && (out - outstart + 5 < *outlen)) {
        if (xmlLittleEndian) {
	    c= *in++;
	} else {
	    tmp = (unsigned char *) in;
	    c = *tmp++;
	    c = c | (((unsigned int)*tmp) << 8);
	    in++;
	}
        if ((c & 0xFC00) == 0xD800) {    /* surrogates */
	    if (in >= inend) {           /* (in > inend) shouldn't happens */
		break;
	    }
	    if (xmlLittleEndian) {
		d = *in++;
	    } else {
		tmp = (unsigned char *) in;
		d = *tmp++;
		d = d | (((unsigned int)*tmp) << 8);
		in++;
	    }
            if ((d & 0xFC00) == 0xDC00) {
                c &= 0x03FF;
                c <<= 10;
                c |= d & 0x03FF;
                c += 0x10000;
            }
            else {
		*outlen = out - outstart;
		*inlenb = processed - inb;
	        return(-2);
	    }
        }

	/* assertion: c is a single UTF-4 value */
        if (out >= outend)
	    break;
        if      (c <    0x80) {  *out++=  c;                bits= -6; }
        else if (c <   0x800) {  *out++= ((c >>  6) & 0x1F) | 0xC0;  bits=  0; }
        else if (c < 0x10000) {  *out++= ((c >> 12) & 0x0F) | 0xE0;  bits=  6; }
        else                  {  *out++= ((c >> 18) & 0x07) | 0xF0;  bits= 12; }

        for ( ; bits >= 0; bits-= 6) {
            if (out >= outend)
	        break;
            *out++= ((c >> bits) & 0x3F) | 0x80;
        }
	processed = (const unsigned char*) in;
    }
    *outlen = out - outstart;
    *inlenb = processed - inb;
    return(*outlen);
}